

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cinproc.c
# Opt level: O1

void nn_cinproc_connect(nn_ins_item *self,nn_ins_item *peer)

{
  nn_sinproc *self_00;
  nn_list_item *it;
  nn_fsm *owner;
  nn_fsm *peer_00;
  
  owner = (nn_fsm *)(self + -3);
  if (self == (nn_ins_item *)0x0) {
    owner = (nn_fsm *)0x0;
  }
  if (*(int *)&owner[1].fn == 2) {
    self_00 = (nn_sinproc *)nn_alloc_(0x290);
    if (self_00 != (nn_sinproc *)0x0) {
      peer_00 = (nn_fsm *)(peer + -3);
      if (peer == (nn_ins_item *)0x0) {
        peer_00 = (nn_fsm *)0x0;
      }
      nn_sinproc_init(self_00,1,(nn_ep *)owner[1].srcptr,owner);
      it = nn_list_end((nn_list *)&owner[1].ctx);
      nn_list_insert((nn_list *)&owner[1].ctx,&self_00->item,it);
      nn_sinproc_connect(self_00,peer_00);
      nn_ep_stat_increment((nn_ep *)owner[1].srcptr,0xca,-1);
      nn_ep_stat_increment((nn_ep *)owner[1].srcptr,0x65,1);
      return;
    }
  }
  else {
    nn_cinproc_connect_cold_1();
  }
  nn_cinproc_connect_cold_2();
}

Assistant:

static void nn_cinproc_connect (struct nn_ins_item *self,
    struct nn_ins_item *peer)
{
    struct nn_cinproc *cinproc;
    struct nn_binproc *binproc;
    struct nn_sinproc *sinproc;

    cinproc = nn_cont (self, struct nn_cinproc, item);
    binproc = nn_cont (peer, struct nn_binproc, item);

    nn_assert_state (cinproc, NN_CINPROC_STATE_ACTIVE);

    sinproc = nn_alloc (sizeof (struct nn_sinproc), "sinproc");
    alloc_assert (sinproc);
    nn_sinproc_init (sinproc, NN_CINPROC_SRC_SINPROC,
        cinproc->item.ep, &cinproc->fsm);

    nn_list_insert (&cinproc->sinprocs, &sinproc->item,
        nn_list_end (&cinproc->sinprocs));

    nn_sinproc_connect (sinproc, &binproc->fsm);

    nn_ep_stat_increment (cinproc->item.ep, NN_STAT_INPROGRESS_CONNECTIONS, -1);
    nn_ep_stat_increment (cinproc->item.ep, NN_STAT_ESTABLISHED_CONNECTIONS, 1);
}